

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

bool test_SSTableData_merge(void)

{
  size_t __n;
  int iVar1;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_01;
  bool bVar2;
  pointer pSVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  initializer_list<SSTableDataEntry> __l;
  initializer_list<SSTableDataEntry> __l_00;
  initializer_list<SSTableDataEntry> __l_01;
  initializer_list<SSTableDataEntry> __l_02;
  SSTableData merged_data;
  SSTableData baseline;
  allocator_type local_361;
  SSTableData local_360;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_348;
  SSTableDataEntry local_330;
  SSTableDataEntry local_2f0;
  SSTableDataEntry local_2b0;
  SSTableDataEntry local_270;
  SSTableDataEntry local_230;
  SSTableDataEntry local_1f0;
  SSTableDataEntry local_1b0;
  SSTableDataEntry local_170;
  SSTableDataEntry local_130;
  SSTableDataEntry local_f0;
  SSTableDataEntry local_b0;
  SSTableDataEntry local_70;
  
  this = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,false,0x4840e3f3,3,"asdasd");
  SSTableDataEntry::SSTableDataEntry(&local_270,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0x497ff7f0,10,"Hello,NIMO");
  __l._M_len = 5;
  __l._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (this,__l,(allocator_type *)&local_360);
  lVar5 = -0x140;
  paVar4 = &local_230.value.field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  this_00 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,0,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0x75bc703,2,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,true,0x4840e3f4,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_270,false,0x12d0e3,4,"NIMO!");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0xbc28e1,0xf,"Hello,NIMO2");
  __l_00._M_len = 5;
  __l_00._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (this_00,__l_00,(allocator_type *)&local_360);
  lVar5 = -0x140;
  paVar4 = &local_230.value.field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  this_01 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,0x14,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0x75bc703,0x16,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,true,0x4840e3f4,0x17,"");
  SSTableDataEntry::SSTableDataEntry(&local_270,false,0x12d0e3,0x18,"NIMO!");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0xbc28e1,0x19,"Hello,NIMO2");
  __l_01._M_len = 5;
  __l_01._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (this_01,__l_01,(allocator_type *)&local_360);
  lVar5 = -0x140;
  paVar4 = &local_230.value.field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
            (&local_360,this,this_00,this_01);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,0,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,false,0x75bc703,2,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_270,true,0x4840e3f4,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_1f0,false,0x497ff7f0,10,"Hello,NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_1b0,false,0xbc28e1,0xf,"Hello,NIMO2");
  SSTableDataEntry::SSTableDataEntry(&local_170,false,0xbc614e,0x14,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_130,false,0x75bc703,0x16,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_f0,true,0x4840e3f4,0x17,"");
  SSTableDataEntry::SSTableDataEntry(&local_b0,false,0x12d0e3,0x18,"NIMO!");
  SSTableDataEntry::SSTableDataEntry(&local_70,false,0xbc28e1,0x19,"Hello,NIMO2");
  __l_02._M_len = 0xc;
  __l_02._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&local_348,__l_02,&local_361);
  lVar5 = -0x300;
  paVar4 = &local_70.value.field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  if ((long)local_360.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_360.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_348.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_348.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    bVar2 = true;
    if (local_360.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_360.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar5 = 0x20;
      do {
        if ((((*(char *)((long)local_360.
                               super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x20) !=
               *(char *)((long)local_348.
                               super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x20)) ||
             (*(long *)((long)local_360.
                              super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x18) !=
              *(long *)((long)local_348.
                              super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x18))) ||
            (*(long *)((long)local_360.
                             super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8) !=
             *(long *)((long)local_348.
                             super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8))) ||
           ((__n = *(size_t *)
                    ((long)&(local_360.
                             super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start)->timestamp + lVar5),
            __n != *(size_t *)
                    ((long)&(local_348.
                             super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start)->timestamp + lVar5) ||
            ((__n != 0 &&
             (iVar1 = bcmp(*(void **)(&(local_360.
                                        super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->delete_flag +
                                     lVar5),
                           *(void **)(&(local_348.
                                        super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->delete_flag +
                                     lVar5),__n), iVar1 != 0)))))) goto LAB_001054d3;
        pSVar3 = (pointer)((long)&((local_360.
                                    super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->value)._M_dataplus.
                                  _M_p + lVar5);
        lVar5 = lVar5 + 0x40;
      } while (pSVar3 != local_360.
                         super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
LAB_001054d3:
    bVar2 = false;
  }
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_348);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_360);
  return bVar2;
}

Assistant:

bool test_SSTableData_merge() {
    auto *data1 = new SSTableData{
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {false, 1212212211, 3,  "asdasd"},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"}
    };
    auto *data2 = new SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 123455235,  2,  "LLLLLL"},
            {true,  1212212212, 3,  ""},
            {false, 1233123,    4,  "NIMO!"},
            {false, 12331233,   15, "Hello,NIMO2"}
    };
    auto *data3 = new SSTableData{
            {false, 12345678,   20, "Hello,World!"},
            {false, 123455235,  22, "LLLLLL"},
            {true,  1212212212, 23, ""},
            {false, 1233123,    24, "NIMO!"},
            {false, 12331233,   25, "Hello,NIMO2"}
    };
    auto merged_data = SSTableData{merge(data1, data2, data3)};
    auto baseline = SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455235,  2,  "LLLLLL"},
            {true,  1212212212, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"},
            {false, 12331233,   15, "Hello,NIMO2"},
            {false, 12345678,   20, "Hello,World!"},
            {false, 123455235,  22, "LLLLLL"},
            {true,  1212212212, 23, ""},
            {false, 1233123,    24, "NIMO!"},
            {false, 12331233,   25, "Hello,NIMO2"}
    };
    return std::equal(merged_data.begin(), merged_data.end(), baseline.begin(), baseline.end(),
                      [](const SSTableDataEntry &e1, const SSTableDataEntry &e2) {
                          return e1.delete_flag == e2.delete_flag && e1.timestamp == e2.timestamp &&
                                 e1.value_length == e2.value_length && e1.value_length == e2.value_length &&
                                 e1.value == e2.value;
                      });
}